

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void dec_build_prediction_by_left_pred
               (MACROBLOCKD *xd,int rel_mi_row,int rel_mi_col,uint8_t op_mi_size,int dir,
               MB_MODE_INFO *left_mbmi,void *fun_ctxt,int num_planes)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  byte in_CL;
  long in_RDI;
  void *in_R9;
  int in_stack_00000010;
  int bh;
  int bw;
  macroblockd_plane *pd;
  int j;
  BLOCK_SIZE bsize;
  MB_MODE_INFO backup_mbmi;
  int mi_y;
  int mi_x;
  int left_mi_row;
  build_prediction_ctxt *ctxt;
  int in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  int in_stack_fffffffffffffef0;
  int iVar5;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 uVar6;
  undefined1 local_e8 [4];
  int in_stack_ffffffffffffff1c;
  DecoderCodingBlock *in_stack_ffffffffffffff20;
  AV1_COMMON *in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  MB_MODE_INFO *in_stack_ffffffffffffff58;
  uint8_t in_stack_ffffffffffffff63;
  int in_stack_ffffffffffffff64;
  MACROBLOCKD *in_stack_ffffffffffffff68;
  
  memcpy(local_e8,in_R9,0xb0);
  av1_setup_build_prediction_by_left_pred
            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,in_stack_ffffffffffffff63,
             in_stack_ffffffffffffff58,
             (build_prediction_ctxt *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff4c);
  iVar1 = *(int *)(in_RDI + 4);
  uVar6 = CONCAT13(*(undefined1 *)**(undefined8 **)(in_RDI + 0x1eb8),(int3)in_stack_ffffffffffffff14
                  );
  for (iVar5 = 0; iVar5 < in_stack_00000010; iVar5 = iVar5 + 1) {
    lVar4 = in_RDI + 0x10 + (long)iVar5 * 0xa30;
    clamp((int)(uint)block_size_wide[(byte)((uint)uVar6 >> 0x18)] >>
          ((char)*(undefined4 *)(lVar4 + 4) + 1U & 0x1f),4,
          0x40 >> ((char)*(undefined4 *)(lVar4 + 4) + 1U & 0x1f));
    iVar2 = (int)((uint)in_CL << 2) >> ((byte)*(undefined4 *)(lVar4 + 8) & 0x1f);
    iVar3 = av1_skip_u4x4_pred_in_obmc
                      ((BLOCK_SIZE)((uint)in_stack_fffffffffffffef0 >> 0x18),
                       (macroblockd_plane *)
                       CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),0);
    if (iVar3 == 0) {
      in_stack_fffffffffffffef0 = iVar1 << 2;
      dec_build_inter_predictors
                (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                 (MB_MODE_INFO *)CONCAT44(uVar6,iVar5),(int)((ulong)lVar4 >> 0x20),(int)lVar4,
                 in_stack_ffffffffffffff40,in_stack_ffffffffffffff48,in_stack_ffffffffffffff50);
      in_stack_fffffffffffffee8 = iVar2;
    }
  }
  return;
}

Assistant:

static inline void dec_build_prediction_by_left_pred(
    MACROBLOCKD *const xd, int rel_mi_row, int rel_mi_col, uint8_t op_mi_size,
    int dir, MB_MODE_INFO *left_mbmi, void *fun_ctxt, const int num_planes) {
  struct build_prediction_ctxt *ctxt = (struct build_prediction_ctxt *)fun_ctxt;
  const int left_mi_row = xd->mi_row + rel_mi_row;
  int mi_x, mi_y;
  MB_MODE_INFO backup_mbmi = *left_mbmi;

  (void)rel_mi_col;
  (void)dir;

  av1_setup_build_prediction_by_left_pred(xd, rel_mi_row, op_mi_size,
                                          &backup_mbmi, ctxt, num_planes);
  mi_x = xd->mi_col << MI_SIZE_LOG2;
  mi_y = left_mi_row << MI_SIZE_LOG2;
  const BLOCK_SIZE bsize = xd->mi[0]->bsize;

  for (int j = 0; j < num_planes; ++j) {
    const struct macroblockd_plane *pd = &xd->plane[j];
    int bw = clamp(block_size_wide[bsize] >> (pd->subsampling_x + 1), 4,
                   block_size_wide[BLOCK_64X64] >> (pd->subsampling_x + 1));
    int bh = (op_mi_size << MI_SIZE_LOG2) >> pd->subsampling_y;

    if (av1_skip_u4x4_pred_in_obmc(bsize, pd, 1)) continue;
    dec_build_inter_predictors(ctxt->cm, (DecoderCodingBlock *)ctxt->dcb, j,
                               &backup_mbmi, 1, bw, bh, mi_x, mi_y);
  }
}